

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Label __thiscall
asmjit::CodeBuilder::newNamedLabel
          (CodeBuilder *this,char *name,size_t nameLength,uint32_t type,uint32_t parentId)

{
  Error EVar1;
  long *message;
  undefined8 *puVar2;
  long in_RSI;
  CodeEmitter *in_RDI;
  Label LVar3;
  Error err;
  CBLabel *node;
  uint32_t id;
  size_t allocatedSize;
  char *in_stack_000002b0;
  int in_stack_000002bc;
  char *in_stack_000002c0;
  CodeEmitter *this_00;
  undefined4 local_104;
  size_t *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  ZoneHeap *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  local_104 = 0xffffffff;
  this_00 = in_RDI;
  if (*(int *)(in_RSI + 0x2c) == 0) {
    message = (long *)(in_RSI + 0xe0);
    if (*message == 0) {
      DebugUtils::assertionFailed(in_stack_000002c0,in_stack_000002bc,in_stack_000002b0);
    }
    puVar2 = (undefined8 *)
             ZoneHeap::_alloc(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 4;
    *(undefined1 *)((long)puVar2 + 0x11) = 0;
    *(short *)((long)puVar2 + 0x12) = (short)*(undefined4 *)(in_RSI + 0x18c);
    *(undefined4 *)((long)puVar2 + 0x14) = *(undefined4 *)(in_RSI + 0x188);
    puVar2[3] = 0;
    puVar2[4] = 0;
    *(undefined4 *)(puVar2 + 5) = 0xffffffff;
    *(undefined4 *)((long)puVar2 + 0x2c) = 0;
    puVar2[6] = 0;
    if (puVar2 == (undefined8 *)0x0) {
      CodeEmitter::setLastError(this_00,(Error)((ulong)in_RDI >> 0x20),(char *)message);
    }
    else {
      EVar1 = CodeHolder::newNamedLabelId
                        ((CodeHolder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                         ,in_stack_ffffffffffffff78,
                         (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         in_stack_ffffffffffffff60);
      if (EVar1 == 0) {
        local_104 = *(undefined4 *)(puVar2 + 5);
      }
      else {
        CodeEmitter::setLastError(this_00,(Error)((ulong)in_RDI >> 0x20),(char *)message);
      }
    }
  }
  in_RDI->_vptr_CodeEmitter = (_func_int **)CONCAT44(local_104,4);
  (in_RDI->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (in_RDI->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar3.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x0;
  LVar3.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this_00;
  return (Label)LVar3.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeBuilder::newNamedLabel(const char* name, size_t nameLength, uint32_t type, uint32_t parentId) {
  uint32_t id = kInvalidValue;

  if (!_lastError) {
    CBLabel* node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node)) {
      setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    }
    else {
      Error err = _code->newNamedLabelId(id, name, nameLength, type, parentId);
      if (ASMJIT_UNLIKELY(err))
        setLastError(err);
      else
        id = node->getId();
    }
  }

  return Label(id);
}